

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_service_handler.c
# Opt level: O0

int do_cmp_peek(csp_cmp_message *cmp)

{
  __uint32_t _Var1;
  long in_RDI;
  int local_4;
  
  _Var1 = __bswap_32(*(__uint32_t *)(in_RDI + 2));
  *(__uint32_t *)(in_RDI + 2) = _Var1;
  if (*(byte *)(in_RDI + 6) < 0xc9) {
    (*csp_cmp_memcpy_fnc)
              ((csp_memptr_t)(in_RDI + 7),(csp_const_memptr_t)*(undefined4 *)(in_RDI + 2),
               (size_t)*(undefined1 *)(in_RDI + 6));
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

static int do_cmp_peek(struct csp_cmp_message * cmp) {

	cmp->peek.addr = htobe32(cmp->peek.addr);
	if (cmp->peek.len > CSP_CMP_PEEK_MAX_LEN)
		return CSP_ERR_INVAL;

	/* Dangerous, you better know what you are doing */
	csp_cmp_memcpy_fnc((csp_memptr_t)(uintptr_t)cmp->peek.data, (csp_memptr_t)(uintptr_t)cmp->peek.addr, cmp->peek.len);

	return CSP_ERR_NONE;
}